

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>_>_>
* TasGrid::IO::getStringToRefinementMap_abi_cxx11_(void)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>_>_>
  *in_RDI;
  long *plVar1;
  long lVar2;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>_>
  __l;
  allocator_type local_ea;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_e9;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>
  local_e8;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined4 local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined4 local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined4 local_50;
  long *local_48 [2];
  long local_38 [2];
  undefined4 local_28;
  
  local_e8.first._M_dataplus._M_p = (pointer)&local_e8.first.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"classic","");
  local_e8.second = refine_classic;
  local_c0[0] = local_b0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"parents","");
  local_a0 = 1;
  local_98[0] = local_88;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"direction","");
  local_78 = 2;
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"fds","");
  local_50 = 3;
  plVar1 = local_38;
  local_48[0] = plVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"stable","");
  local_28 = 4;
  __l._M_len = 5;
  __l._M_array = &local_e8;
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasGrid::TypeRefinement>_>_>
  ::map(in_RDI,__l,&local_e9,&local_ea);
  lVar2 = -200;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  return in_RDI;
}

Assistant:

inline std::map<std::string, TypeRefinement> getStringToRefinementMap(){
    return std::initializer_list<std::pair<std::string const, TypeRefinement>>{
        {"classic",   refine_classic},
        {"parents",   refine_parents_first},
        {"direction", refine_direction_selective},
        {"fds",       refine_fds},
        {"stable",    refine_stable}};
}